

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::PragmaFunctionExtractor::GetParameterTypes
                  (Value *__return_storage_ptr__,PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  reference this;
  __node_base *p_Var1;
  idx_t i;
  ulong __n;
  vector<duckdb::Value,_true> results;
  string local_188;
  vector<duckdb::Value,_true> local_168;
  PragmaFunction fun;
  
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (&fun,&(entry->functions).super_FunctionSet<duckdb::PragmaFunction>,offset);
  for (__n = 0; __n < (ulong)(((long)fun.super_SimpleNamedParameterFunction.super_SimpleFunction.
                                     arguments.
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)fun.super_SimpleNamedParameterFunction.super_SimpleFunction.
                                    arguments.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    this = vector<duckdb::LogicalType,_true>::get<true>
                     (&fun.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments,__n);
    LogicalType::ToString_abi_cxx11_(&local_188,this);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&results,&local_188);
    ::std::__cxx11::string::~string((string *)&local_188);
  }
  p_Var1 = &fun.named_parameters._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    LogicalType::ToString_abi_cxx11_(&local_188,(LogicalType *)(p_Var1 + 5));
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&results,&local_188);
    ::std::__cxx11::string::~string((string *)&local_188);
  }
  LogicalType::LogicalType((LogicalType *)&local_188,VARCHAR);
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  results.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(__return_storage_ptr__,(LogicalType *)&local_188,&local_168);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168);
  LogicalType::~LogicalType((LogicalType *)&local_188);
  PragmaFunction::~PragmaFunction(&fun);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&results);
  return __return_storage_ptr__;
}

Assistant:

static Value GetParameterTypes(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto fun = entry.functions.GetFunctionByOffset(offset);

		for (idx_t i = 0; i < fun.arguments.size(); i++) {
			results.emplace_back(fun.arguments[i].ToString());
		}
		for (auto &param : fun.named_parameters) {
			results.emplace_back(param.second.ToString());
		}
		return Value::LIST(LogicalType::VARCHAR, std::move(results));
	}